

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_connecthost(connectdata *conn,Curl_dns_entry *remotehost)

{
  long *plVar1;
  Curl_easy *data;
  int iVar2;
  CURLcode CVar3;
  ulong uVar4;
  CURLcode CVar5;
  Curl_addrinfo *ai;
  curltime cVar6;
  curltime before;
  curltime local_38;
  
  data = conn->data;
  cVar6 = Curl_now();
  local_38.tv_sec = cVar6.tv_sec;
  local_38.tv_usec = cVar6.tv_usec;
  uVar4 = Curl_timeleft(data,&local_38,true);
  if ((long)uVar4 < 0) {
    Curl_failf(data,"Connection time-out");
    CVar3 = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    iVar2 = Curl_num_addresses(remotehost->addr);
    conn->num_addr = iVar2;
    ai = remotehost->addr;
    conn->tempaddr[0] = ai;
    conn->tempaddr[1] = (Curl_addrinfo *)0x0;
    conn->tempsock[0] = -1;
    conn->tempsock[1] = -1;
    conn->timeoutms_per_addr = uVar4 >> (ai->ai_next != (Curl_addrinfo *)0x0);
    if (ai == (Curl_addrinfo *)0x0) {
      CVar5 = CURLE_COULDNT_CONNECT;
    }
    else {
      do {
        CVar3 = singleipconnect(conn,ai,0);
        CVar5 = CURLE_OK;
        if (CVar3 == CURLE_OK) break;
        ai = conn->tempaddr[0]->ai_next;
        conn->tempaddr[0] = ai;
        CVar5 = CVar3;
      } while (ai != (Curl_addrinfo *)0x0);
    }
    if (conn->tempsock[0] == -1) {
      CVar3 = CURLE_COULDNT_CONNECT;
      if (CVar5 != CURLE_OK) {
        CVar3 = CVar5;
      }
    }
    else {
      plVar1 = &(data->info).numconnects;
      *plVar1 = *plVar1 + 1;
      Curl_expire(conn->data,(data->set).happy_eyeballs_timeout,EXPIRE_HAPPY_EYEBALLS);
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_connecthost(struct connectdata *conn,  /* context */
                          const struct Curl_dns_entry *remotehost)
{
  struct Curl_easy *data = conn->data;
  struct curltime before = Curl_now();
  CURLcode result = CURLE_COULDNT_CONNECT;

  timediff_t timeout_ms = Curl_timeleft(data, &before, TRUE);

  if(timeout_ms < 0) {
    /* a precaution, no need to continue if time already is up */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  conn->num_addr = Curl_num_addresses(remotehost->addr);
  conn->tempaddr[0] = remotehost->addr;
  conn->tempaddr[1] = NULL;
  conn->tempsock[0] = CURL_SOCKET_BAD;
  conn->tempsock[1] = CURL_SOCKET_BAD;

  /* Max time for the next connection attempt */
  conn->timeoutms_per_addr =
    conn->tempaddr[0]->ai_next == NULL ? timeout_ms : timeout_ms / 2;

  /* start connecting to first IP */
  while(conn->tempaddr[0]) {
    result = singleipconnect(conn, conn->tempaddr[0], 0);
    if(!result)
      break;
    conn->tempaddr[0] = conn->tempaddr[0]->ai_next;
  }

  if(conn->tempsock[0] == CURL_SOCKET_BAD) {
    if(!result)
      result = CURLE_COULDNT_CONNECT;
    return result;
  }

  data->info.numconnects++; /* to track the number of connections made */
  Curl_expire(conn->data, data->set.happy_eyeballs_timeout,
              EXPIRE_HAPPY_EYEBALLS);

  return CURLE_OK;
}